

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

char * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::TryAllocFromZeroPagesList
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,uint pageCount,PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment,
          BackgroundPageQueue *bgPageQueue,bool isPendingZeroList)

{
  size_t *psVar1;
  PageSegmentBase<Memory::VirtualAllocWrapper> *segment;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  DWORD DVar5;
  FreePageEntry *pFVar6;
  undefined4 *puVar7;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *fromSegmentList;
  ThreadContextId pvVar8;
  size_t __n;
  uint uVar9;
  FreePageEntry *address;
  ulong uVar10;
  FreePageEntry *local_48;
  
  if (DAT_015d6420 == '\x01') {
    __n = 0x18;
    if (isPendingZeroList) {
      __n = (ulong)(pageCount << 0xc);
    }
    address = (FreePageEntry *)0x0;
    local_48 = (FreePageEntry *)0x0;
    do {
      if (isPendingZeroList) {
        pFVar6 = ZeroPageQueue::PopZeroPageEntry((ZeroPageQueue *)this->backgroundPageQueue);
      }
      else {
        pFVar6 = BackgroundPageQueue::PopFreePageEntry(this->backgroundPageQueue);
      }
      if (pFVar6 == (FreePageEntry *)0x0) {
        bVar3 = false;
      }
      else if (pFVar6->pageCount == pageCount) {
        *pageSegment = pFVar6->segment;
        bVar3 = false;
        memset(pFVar6,0,__n);
        FillAllocPages(this,pFVar6,pageCount);
        local_48 = pFVar6;
      }
      else {
        if (isPendingZeroList) {
          memset(pFVar6 + 1,0,(ulong)(pFVar6->pageCount << 0xc) - 0x18);
        }
        pFVar6->Next = address;
        bVar3 = true;
        uVar9 = pFVar6->pageCount - pageCount;
        address = pFVar6;
        if (pageCount <= pFVar6->pageCount && uVar9 != 0) {
          *pageSegment = pFVar6->segment;
          pFVar6->pageCount = uVar9;
          local_48 = (FreePageEntry *)((long)&pFVar6->Next + (ulong)(uVar9 * 0x1000));
          FillAllocPages(this,local_48,pageCount);
          bVar3 = false;
        }
      }
    } while (bVar3);
  }
  else {
    address = (FreePageEntry *)0x0;
    local_48 = (FreePageEntry *)0x0;
  }
  if (address != (FreePageEntry *)0x0) {
    uVar4 = 0;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      pFVar6 = address->Next;
      segment = address->segment;
      uVar9 = address->pageCount;
      fromSegmentList = GetSegmentList(this,segment);
      if (fromSegmentList ==
          (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x3b2,"(fromSegmentList != nullptr)","fromSegmentList != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      address->Next = (FreePageEntry *)0x0;
      address->segment = (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0;
      *(undefined8 *)&address->pageCount = 0;
      PageSegmentBase<Memory::VirtualAllocWrapper>::ReleasePages(segment,address,uVar9);
      uVar4 = uVar4 + uVar9;
      TransferSegment(this,segment,fromSegmentList);
      address = pFVar6;
    } while (pFVar6 != (FreePageEntry *)0x0);
    uVar10 = (ulong)uVar4;
    SubUsedBytes(this,uVar10 << 0xc);
    if (this->memoryData != (PageMemoryData *)0x0) {
      psVar1 = &this->memoryData->releasePageCount;
      *psVar1 = *psVar1 + uVar10;
    }
    bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if ((bVar3) && (this->pageAllocatorFlagTable->Verbose == true)) {
      pvVar8 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar5 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar8,(ulong)DVar5,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      Output::Print(L"New free pages: %d\n",(ulong)uVar4);
      Output::Print(L"\n");
      Output::Flush();
    }
    UpdateMinFreePageCount(this);
    uVar10 = uVar10 + this->freePageCount;
    this->freePageCount = uVar10;
    if (uVar10 < this->debugMinFreePageCount) {
      this->debugMinFreePageCount = uVar10;
    }
  }
  return (char *)local_48;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TryAllocFromZeroPagesList(
    uint pageCount, TPageSegment ** pageSegment, BackgroundPageQueue* bgPageQueue, bool isPendingZeroList)
{
    FAULTINJECT_MEMORY_NOTHROW(this->debugName, pageCount*AutoSystemInfo::PageSize);

    char * pages = nullptr;
    FreePageEntry* localList = nullptr;

#if ENABLE_BACKGROUND_PAGE_ZEROING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        while (true)
        {
            FreePageEntry * freePage = isPendingZeroList ? ((ZeroPageQueue *)backgroundPageQueue)->PopZeroPageEntry() : backgroundPageQueue->PopFreePageEntry();
            if (freePage == nullptr)
            {
                break;
            }

            if (freePage->pageCount == pageCount)
            {
                *pageSegment = freePage->segment;
                pages = (char *)freePage;
                memset(pages, 0, isPendingZeroList ? (pageCount*AutoSystemInfo::PageSize) : sizeof(FreePageEntry));
                this->FillAllocPages(pages, pageCount);
                break;
            }
            else
            {
                if (isPendingZeroList)
                {
                    memset((char *)freePage + sizeof(FreePageEntry), 0, (freePage->pageCount*AutoSystemInfo::PageSize) - sizeof(FreePageEntry));
                }

                freePage->Next = localList;
                localList = (FreePageEntry*)freePage;

                if (freePage->pageCount > pageCount)
                {
                    *pageSegment = freePage->segment;
                    freePage->pageCount -= pageCount;
                    pages = (char *)freePage + freePage->pageCount * AutoSystemInfo::PageSize;
                    this->FillAllocPages(pages, pageCount);
                    break;
                }
            }
        }
    }
#endif

    if (localList != nullptr)
    {
        uint newFreePages = 0;
        while (localList != nullptr)
        {
            FreePageEntry* freePagesEntry = localList;
            localList = (FreePageEntry*)localList->Next;

            TPageSegment * segment = freePagesEntry->segment;
            pageCount = freePagesEntry->pageCount;

            DListBase<TPageSegment> * fromSegmentList = GetSegmentList(segment);
            Assert(fromSegmentList != nullptr);

            memset(freePagesEntry, 0, sizeof(FreePageEntry));

            segment->ReleasePages(freePagesEntry, pageCount);
            newFreePages += pageCount;

            TransferSegment(segment, fromSegmentList);

        }

        LogFreePages(newFreePages);
        PAGE_ALLOC_VERBOSE_TRACE(_u("New free pages: %d\n"), newFreePages);
        this->AddFreePageCount(newFreePages);
#if DBG
        UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif
    }

    return pages;
}